

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.c
# Opt level: O3

void solvhandler(void)

{
  short sVar1;
  int numeqn;
  Item *pIVar2;
  Symbol *fun;
  Item *q;
  long lVar3;
  List *pLVar4;
  uint steadystate;
  int iVar5;
  int iVar6;
  Symbol *pSVar7;
  long lVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  undefined8 extraout_RDX;
  undefined8 uVar9;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  char *pcVar10;
  List *pLVar11;
  int btype;
  Item *pIVar12;
  short sVar13;
  List *errstmt;
  anon_union_8_4_46e41722_for_element local_40;
  long local_38;
  
  if (solvq == (List *)0x0) {
    solvq = newlist();
  }
  init_disc_vars();
  pIVar12 = solvq->next;
  uVar9 = extraout_RDX;
  do {
    pLVar4 = solvq;
    iVar5 = (int)uVar9;
    if (pIVar12 == solvq) {
      return;
    }
    sVar1 = pIVar12->itemtype;
    steadystate = 0;
    sVar13 = sVar1;
    if (sVar1 < 0) {
      sVar13 = -sVar1;
      pIVar12->itemtype = sVar13;
      pLVar11 = pLVar4->next;
      steadystate = 1;
      if (pLVar11 != pLVar4) {
        do {
          pIVar2 = (Item *)((pLVar11->element).sym)->subtype;
          if (pIVar2 == (pIVar12->element).itm) {
            pSVar7 = (pLVar11->next->element).sym;
            if (pLVar11->itemtype == 0x400) {
              pcVar10 = 
              "STEADYSTATE requires all SOLVE\'s of this KINETIC block to use the\nsame method (`advance\' or `sparse\'). :"
              ;
              if ((Symbol *)(pIVar12->next->element).itm != pSVar7) goto LAB_0010cdd9;
              if (pSVar7 == (Symbol *)0x0) goto LAB_0010cdeb;
              iVar5 = strcmp("sparse",pSVar7->name);
              pcVar10 = 
              "STEADYSTATE requires all SOLVE\'s of this KINETIC block to use the\nsame method (`advance\' or `sparse\'). :"
              ;
              uVar9 = extraout_RDX_01;
            }
            else {
              pcVar10 = "STEADYSTATE only valid for SOLVEing a KINETIC or DERIVATIVE block:";
              if ((pLVar11->itemtype != 0x200) ||
                 (pcVar10 = 
                  "STEADYSTATE requires all SOLVE\'s of this DERIVATIVE block to use the\n`derivimplicit\' method:"
                 , pSVar7 == (Symbol *)0x0)) goto LAB_0010cdd9;
              iVar5 = strcmp("derivimplicit",pSVar7->name);
              pcVar10 = 
              "STEADYSTATE requires all SOLVE\'s of this DERIVATIVE block to use the\n`derivimplicit\' method:"
              ;
              uVar9 = extraout_RDX_00;
            }
            if (iVar5 != 0) {
LAB_0010cdd9:
              diag(pcVar10,pIVar2[2].element.str);
            }
          }
LAB_0010cdeb:
          iVar5 = (int)uVar9;
          pLVar11 = pLVar11->next->next->next;
        } while (pLVar11 != pLVar4);
        steadystate = 1;
      }
    }
    pIVar2 = (pIVar12->element).itm;
    pIVar12 = pIVar12->next;
    pSVar7 = (pIVar12->element).sym;
    lVar8 = 0;
    if (pSVar7 == (Symbol *)0x0) {
LAB_0010ce79:
      pSVar7 = (Symbol *)0x0;
    }
    else {
      pcVar10 = pSVar7->name;
      iVar5 = strcmp(pcVar10,"after_cvode");
      if (iVar5 == 0) {
        lVar8 = 1;
        iVar5 = extraout_EDX;
LAB_0010ce71:
        (pIVar12->element).itm = (Item *)0x0;
        goto LAB_0010ce79;
      }
      iVar5 = strcmp(pcVar10,"cvode_t");
      if (iVar5 == 0) {
        lVar8 = 2;
        iVar5 = extraout_EDX_00;
        goto LAB_0010ce71;
      }
      iVar6 = strcmp(pcVar10,"cvode_v");
      lVar8 = 0;
      iVar5 = extraout_EDX_01;
      if (iVar6 == 0) {
        lVar8 = 3;
        goto LAB_0010ce71;
      }
    }
    pIVar12 = pIVar12->next;
    local_40 = pIVar12->element;
    fun = (pIVar2->element).sym;
    q = pIVar2->next;
    iVar6 = (fun->u).i;
    numeqn = fun->used;
    if ((pSVar7 != (Symbol *)0x0) && ((pSVar7->subtype & fun->subtype) == 0)) {
      local_38 = lVar8;
      sprintf(buf,"Method %s can\'t be used with Block %s",pSVar7->name,fun->name);
      diag(buf,(char *)0x0);
    }
    btype = (int)sVar13;
    lVar3 = fun->subtype;
    if (lVar3 < 0x400) {
      if (lVar3 == 0x80) {
        if (btype == 0x130) {
          whileloop((Item *)0x200,0,iVar5);
          (*(code *)(&DAT_00126484 + *(int *)(&DAT_00126484 + lVar8 * 4)))();
          return;
        }
        sprintf(buf," %s();\n",fun->name);
        replacstr(pIVar2,buf);
        sprintf(buf,"{ %s(_threadargs_); }\n",fun->name);
        vectorize_substitute(pIVar2,buf);
      }
      else {
        if (lVar3 != 0x200) {
LAB_0010d163:
          diag("Illegal or unimplemented SOLVE type: ",fun->name);
        }
        if (pSVar7 == (Symbol *)0x0) {
          pSVar7 = lookup("adrunge");
          iVar5 = extraout_EDX_02;
        }
        if (btype == 0x130 && -1 < sVar1) {
          pcVar10 = pSVar7->name;
          iVar5 = strcmp(pcVar10,"cnexp");
          if (((iVar5 != 0) && (iVar5 = strcmp(pcVar10,"derivimplicit"), iVar5 != 0)) &&
             (iVar5 = strcmp(pcVar10,"euler"), iVar5 != 0)) {
            solvhandler_cold_4();
          }
          sens_nonlin_out(q,fun);
          cvode_interface(fun,iVar6,numeqn);
          iVar5 = extraout_EDX_04;
        }
        else if (btype != 0x130) goto LAB_0010d113;
        whileloop((Item *)0x200,(ulong)steadystate,iVar5);
LAB_0010d113:
        solv_diffeq(pIVar2,fun,pSVar7,numeqn,iVar6,steadystate,btype);
      }
    }
    else {
      if (lVar3 < 0x800) {
        if (lVar3 != 0x400) goto LAB_0010d163;
        if (pSVar7 == (Symbol *)0x0) {
          pSVar7 = lookup("_advance");
          iVar5 = extraout_EDX_03;
        }
        if (btype == 0x130) {
          if ((pSVar7->subtype & 0x200) != 0) {
            solvhandler_cold_3();
            iVar5 = extraout_EDX_05;
          }
          whileloop((Item *)0x200,(ulong)steadystate,iVar5);
          iVar5 = strcmp(pSVar7->name,"sparse");
          if (iVar5 == 0) {
            cvode_interface(fun,iVar6,numeqn);
            cvode_kinetic(pIVar2,fun,numeqn,iVar6);
            single_channel(pIVar2,fun,numeqn,iVar6);
          }
        }
        goto LAB_0010d113;
      }
      if (lVar3 < 0x4000) {
        if (lVar3 == 0x800) {
          fwrite("Notice: NONLINEAR is not thread safe.\n",0x26,1,_stderr);
          vectorize = 0;
          if (pSVar7 == (Symbol *)0x0) {
            pSVar7 = lookup("newton");
          }
          solv_nonlin(pIVar2,fun,pSVar7,numeqn,iVar6);
        }
        else {
          if (lVar3 != 0x1000) goto LAB_0010d163;
          solvhandler_cold_2();
        }
      }
      else if (lVar3 == 0x4000) {
        solvhandler_cold_1();
      }
      else {
        if (lVar3 != 0x10000) goto LAB_0010d163;
        fwrite("Notice: LINEAR is not thread safe.\n",0x23,1,_stderr);
        vectorize = 0;
        if (pSVar7 == (Symbol *)0x0) {
          pSVar7 = lookup("simeq");
        }
        solv_lineq(pIVar2,fun,pSVar7,numeqn,iVar6);
      }
    }
    if (btype == 0x130) {
      cvode_valid();
    }
    insertstr(pIVar2,"error =");
    move((local_40.itm)->next,(local_40.itm)->prev,pIVar2->next);
    if ((local_40.itm)->next == (local_40.itm)->prev) {
      vectorize_substitute(pIVar2->next,"");
      vectorize_substitute(pIVar2->prev,"");
    }
    else {
      solvhandler_cold_5();
    }
    freelist(&local_40.lst);
    pIVar12 = pIVar12->next;
    uVar9 = extraout_RDX_02;
  } while( true );
}

Assistant:

void solvhandler()
{
	Item *lq, *qsol, *follow;
	List *errstmt;
	Symbol *fun, *method;
	int numeqn, listnum, btype, steadystate;
	int cvodemethod_;
	
	if (!solvq)
		solvq = newlist();
	init_disc_vars(); /*why not here?*/
	ITERATE(lq, solvq) { /* remember it goes by 3's */
		steadystate=0;
		btype = lq->itemtype;
		if (btype < 0) {
			btype = lq->itemtype = -btype;
			steadystate = 1;
			check_ss_consist(lq);
		}
		qsol = ITM(lq);
		lq = lq->next;
		method = SYM(lq);
#if CVODE
		cvodemethod_ = 0;
		if (method && strcmp(method->name, "after_cvode") == 0) {
			method = (Symbol*)0;
			lq->element.sym = (Symbol*)0;
			cvodemethod_ = 1;
		}
		if (method && strcmp(method->name, "cvode_t") == 0) {
			method = (Symbol*)0;
			lq->element.sym = (Symbol*)0;
			cvodemethod_ = 2;
		}
		if (method && strcmp(method->name, "cvode_v") == 0) {
			method = (Symbol*)0;
			lq->element.sym = (Symbol*)0;
			cvodemethod_ = 3;
		}
#endif	
		lq = lq->next;
		errstmt = LST(lq);
		/* err stmt handling assumes qsol->next is where it goes. */
		fun = SYM(qsol);
		numeqn = fun->used;
		listnum =fun->u.i;
		follow = qsol->next; /* where p[0] gets updated */
		/* Check consistency of method and block type */
		if (method && !(method->subtype & fun->subtype)) {
			Sprintf(buf, "Method %s can't be used with Block %s",
				method->name, fun->name);
			diag(buf, (char *)0);
		}
		
		switch (fun->subtype) {

		case DERF:
			if (method == SYM0) {
				method = lookup("adrunge");
			}
			if (btype == BREAKPOINT && !steadystate) {
				/* derivatives recalculated after while loop */
if (strcmp(method->name, "cnexp") != 0 && strcmp(method->name, "derivimplicit") != 0 && strcmp(method->name, "euler") != 0) {
fprintf(stderr, "Notice: %s is not thread safe. Complain to Hines\n", method->name);
				vectorize = 0;
				Sprintf(buf, " %s();\n", fun->name);
				Insertstr(follow, buf);
		}
				/* envelope calls go after the while loop */
				sens_nonlin_out(follow, fun);
#if CVODE
				cvode_interface(fun, listnum, numeqn);
#endif
			}
			if (btype == BREAKPOINT) whileloop(qsol, (long)DERF, steadystate);
			solv_diffeq(qsol, fun,  method, numeqn, listnum, steadystate, btype);
			break;
		case KINF:
			if (method == SYM0) {
				method = lookup("_advance");
			}
			if (btype == BREAKPOINT && (method->subtype & DERF)) {
#if VECTORIZE
fprintf(stderr, "Notice: KINETIC with is thread safe only with METHOD sparse. Complain to Hines\n");
				vectorize = 0;
#endif
				/* derivatives recalculated after while loop */
				Sprintf(buf, " %s();\n", fun->name);
				Insertstr(follow, buf);
				/* envelope calls go after the while loop */
				sens_nonlin_out(follow, fun);
			}
			if (btype == BREAKPOINT) {
				whileloop(qsol, (long)DERF, steadystate);
#if CVODE
	if (strcmp(method->name, "sparse") == 0) {
				cvode_interface(fun, listnum, numeqn);
				cvode_kinetic(qsol, fun, numeqn, listnum);
				single_channel(qsol, fun, numeqn, listnum);
	}
#endif
			}
			solv_diffeq(qsol, fun,  method, numeqn, listnum, steadystate, btype);
			break;
		case NLINF:
#if VECTORIZE
fprintf(stderr, "Notice: NONLINEAR is not thread safe.\n");
			vectorize = 0;
#endif
			if (method == SYM0) {
				method = lookup("newton");
			}
			solv_nonlin(qsol, fun, method, numeqn, listnum);
			break;
		case LINF:
#if VECTORIZE
fprintf(stderr, "Notice: LINEAR is not thread safe.\n");
			vectorize = 0;
#endif
			if (method == SYM0) {
				method = lookup("simeq");
			}
			solv_lineq(qsol, fun, method, numeqn, listnum);
			break;
		case DISCF:
#if VECTORIZE
fprintf(stderr, "Notice: DISCRETE is not thread safe.\n");
			vectorize = 0;
#endif
			if (btype == BREAKPOINT) whileloop(qsol, (long)DISCRETE, 0);
			Sprintf(buf, "0; %s += d%s; %s();\n",
				indepsym->name, indepsym->name, fun->name);
			replacstr(qsol, buf);
			break;
#if 1	/* really wanted? */
		case PROCED:
			if (btype == BREAKPOINT) {
				whileloop(qsol, (long)DERF, 0);
#if CVODE
	if (cvodemethod_ == 1) { /*after_cvode*/
				cvode_interface(fun, listnum, 0);
	}
	if (cvodemethod_ == 2) { /*cvode_t*/
				cvode_interface(fun, listnum, 0);
				insertstr(qsol, "if (!cvode_active_)");
				cvode_nrn_cur_solve_ = fun;
	}
	if (cvodemethod_ == 3) { /*cvode_t_v*/
				cvode_interface(fun, listnum, 0);
				insertstr(qsol, "if (!cvode_active_)");
				cvode_nrn_current_solve_ = fun;
	}
#endif
			}
			Sprintf(buf, " %s();\n", fun->name);
			replacstr(qsol, buf);
#if VECTORIZE
	Sprintf(buf, "{ %s(_threadargs_); }\n",
		fun->name);
	vectorize_substitute(qsol, buf);
#endif
			break;
#endif
		case PARF:
#if VECTORIZE
fprintf(stderr, "Notice: PARTIAL is not thread safe.\n");
			vectorize = 0;
#endif
			if (btype == BREAKPOINT) whileloop(qsol, (long)DERF, 0);
			solv_partial(qsol, fun);
			break;
		default:
			diag("Illegal or unimplemented SOLVE type: ", fun->name);
			break;
		}
#if CVODE
		if (btype == BREAKPOINT) {
			cvode_valid();
		}
#endif
	/* add the error check */
	Insertstr(qsol, "error =");
	move(errstmt->next, errstmt->prev, qsol->next);
#if VECTORIZE
	if (errstmt->next == errstmt->prev) {
		vectorize_substitute(qsol->next, "");
		vectorize_substitute(qsol->prev, "");
	}else{
fprintf(stderr, "Notice: SOLVE with ERROR is not thread safe.\n");
		vectorize = 0;
	}
#endif
	freelist(&errstmt);
	/* under all circumstances, on return from model,
	 p[0] = current indepvar */
	/* obviously ok if indepvar is original; if it has been changed
	away from time
	then _sav_indep will be reset to starting value of original when
	initmodel is called on every call to model */
#if NMODL
#else
		if (btype == BREAKPOINT) {
#if SIMSYS
			Sprintf(buf, "_sav_indep = %s;\n", indepsym->name);
#else
			Sprintf(buf, "_sav_indep = _p[_indepindex];\n");
#endif
			Insertstr(follow, buf);
		}
#endif
	}
}